

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O3

bool_t decLuhnVerify(char *dec)

{
  uint uVar1;
  size_t sVar2;
  long lVar3;
  
  sVar2 = strLen(dec);
  if (sVar2 == 0) {
    uVar1 = 1;
  }
  else {
    lVar3 = 0;
    do {
      lVar3 = lVar3 + dec[sVar2 - 1] + -0x30;
      if (sVar2 == 1) break;
      lVar3 = lVar3 + *(long *)("pfokTest: %s\n" + (long)dec[sVar2 - 2] * 8 + 7);
      sVar2 = sVar2 - 2;
    } while (sVar2 != 0);
    uVar1 = (uint)(((ulong)(lVar3 * -0x3333333333333333) >> 1 |
                   (ulong)((lVar3 * -0x3333333333333333 & 1U) != 0) << 0x3f) < 0x199999999999999a);
  }
  return uVar1;
}

Assistant:

bool_t decLuhnVerify(const char* dec)
{
	register word cd = 0;
	size_t i;
	ASSERT(decIsValid(dec));
	for (i = strLen(dec); i--;) 
	{
		cd += dec[i] - '0';
		if (i)
			cd += luhn_table[dec[--i] - '0'];
	}
	cd %= 10;
	return wordEq(cd, 0);
}